

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac,REF_DBL *m,REF_DBL *jac_m_jact)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  REF_DBL full [9];
  REF_DBL local_f8 [10];
  double local_a8 [5];
  REF_DBL full_jac_m_jact [9];
  
  full_jac_m_jact[5] = *m;
  full_jac_m_jact[8] = m[1];
  full_jac_m_jact[6] = m[1];
  full_jac_m_jact[7] = m[2];
  lVar2 = 0;
  pRVar4 = jac;
  do {
    lVar6 = 0;
    pRVar5 = full_jac_m_jact + 5;
    do {
      lVar7 = lVar6 * 3 + lVar2;
      local_a8[lVar7] = 0.0;
      dVar8 = 0.0;
      lVar3 = 0;
      pdVar1 = pRVar4;
      do {
        dVar8 = dVar8 + *pdVar1 * pRVar5[lVar3];
        lVar3 = lVar3 + 1;
        pdVar1 = pdVar1 + 3;
      } while (lVar3 != 3);
      local_a8[lVar7] = dVar8;
      lVar6 = lVar6 + 1;
      pRVar5 = pRVar5 + 3;
    } while (lVar6 != 3);
    lVar2 = lVar2 + 1;
    pRVar4 = pRVar4 + 1;
  } while (lVar2 != 3);
  pdVar1 = local_a8;
  lVar2 = 0;
  do {
    lVar6 = 0;
    pRVar4 = jac;
    do {
      lVar3 = lVar6 * 3 + lVar2;
      local_f8[lVar3] = 0.0;
      dVar8 = 0.0;
      lVar7 = 0;
      do {
        dVar8 = dVar8 + *(double *)((long)pdVar1 + lVar7) * *(double *)((long)pRVar4 + lVar7);
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x48);
      local_f8[lVar3] = dVar8;
      lVar6 = lVar6 + 1;
      pRVar4 = pRVar4 + 1;
    } while (lVar6 != 3);
    lVar2 = lVar2 + 1;
    pdVar1 = pdVar1 + 1;
  } while (lVar2 != 3);
  *jac_m_jact = local_f8[0];
  jac_m_jact[1] = local_f8[3];
  jac_m_jact[2] = local_f8[6];
  jac_m_jact[3] = local_f8[4];
  jac_m_jact[4] = local_f8[7];
  jac_m_jact[5] = local_f8[8];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_jac_m_jact(REF_DBL *jac, REF_DBL *m,
                                         REF_DBL *jac_m_jact) {
  REF_DBL full[9];
  REF_DBL jac_m[9];
  REF_DBL full_jac_m_jact[9];
  REF_INT i, j, k;

  RSS(ref_matrix_m_full(m, full), "full");

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      jac_m[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        jac_m[i + 3 * j] += jac[i + 3 * k] * full[k + 3 * j];
      }
    }
  }

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      full_jac_m_jact[i + 3 * j] = 0;
      for (k = 0; k < 3; k++) {
        full_jac_m_jact[i + 3 * j] += jac_m[i + 3 * k] * jac[j + 3 * k];
      }
    }
  }

  RSS(ref_matrix_full_m(full_jac_m_jact, jac_m_jact), "full");

  return REF_SUCCESS;
}